

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O1

void __thiscall
SortedList<MessageQueue::ListEntry>::InsertAfter
          (SortedList<MessageQueue::ListEntry> *this,DListNode<MessageQueue::ListEntry> *newNode,
          DListNode<MessageQueue::ListEntry> *node)

{
  DListNode<MessageQueue::ListEntry> *extraout_RAX;
  DListNode<MessageQueue::ListEntry> *pDVar1;
  
  pDVar1 = this->head;
  if (pDVar1 == (DListNode<MessageQueue::ListEntry> *)0x0) {
    if (node == (DListNode<MessageQueue::ListEntry> *)0x0) goto LAB_00113f0c;
    InsertAfter();
    pDVar1 = extraout_RAX;
LAB_00113f04:
    newNode->next = pDVar1;
  }
  else {
    if (node == (DListNode<MessageQueue::ListEntry> *)0x0) goto LAB_00113f04;
    this = (SortedList<MessageQueue::ListEntry> *)&node->next;
    newNode->next = node->next;
    newNode->prev = node;
    pDVar1 = node->next;
    if (pDVar1 == (DListNode<MessageQueue::ListEntry> *)0x0) goto LAB_00113f0c;
  }
  pDVar1->prev = newNode;
LAB_00113f0c:
  *this = (SortedList<MessageQueue::ListEntry>)newNode;
  return;
}

Assistant:

void InsertAfter(DListNode<T>* newNode, DListNode<T>* node)
    {
        // If the list is empty, just set head to newNode
        if (head == nullptr)
        {
            Assert(node == nullptr);
            head = newNode;
            return;
        }

        // If node is null here, we must be trying to insert before head
        if (node == nullptr)
        {
            newNode->next = head;
            head->prev = newNode;
            head = newNode;
            return;
        }

        Assert(node);
        newNode->next = node->next;
        newNode->prev = node;

        if (node->next)
        {
            node->next->prev = newNode;
        }

        node->next = newNode;
    }